

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int try_psk_handshake(ptls_t *tls,size_t *psk_index,int *accept_early_data,
                     st_ptls_client_hello_t *ch,ptls_iovec_t ch_trunc)

{
  anon_struct_168_2_32182ca3_for_identities *paVar1;
  uint16_t uVar2;
  st_ptls_get_time_t *psVar3;
  st_ptls_encrypt_ticket_t *psVar4;
  char *__s2;
  ptls_key_exchange_algorithm_t *ppVar5;
  size_t sVar6;
  ptls_iovec_t ikm;
  uint8_t *puVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ptls_key_exchange_algorithm_t **pppVar12;
  byte bVar13;
  char *unaff_RBP;
  size_t sVar14;
  ptls_context_t *ppVar15;
  size_t *psVar16;
  char cVar17;
  bool bVar18;
  ptls_iovec_t pVar19;
  uint16_t ticket_csid;
  uint16_t ticket_key_exchange_id;
  st_ptls_client_hello_t *local_108;
  anon_struct_168_2_32182ca3_for_identities *local_100;
  int *local_f8;
  uint32_t age_add;
  ptls_buffer_t local_e8;
  ptls_context_t *local_c8;
  uint8_t *local_c0;
  size_t local_b8;
  uint64_t issue_at;
  ptls_iovec_t ticket_psk;
  ptls_iovec_t ticket_negotiated_protocol;
  ptls_iovec_t ticket_server_name;
  uint8_t binder_key [64];
  
  psVar3 = tls->ctx->get_time;
  local_f8 = accept_early_data;
  local_100 = (anon_struct_168_2_32182ca3_for_identities *)(*psVar3->cb)(psVar3);
  local_e8.base = "";
  local_e8.capacity = 0;
  local_e8.off = 0;
  local_e8._24_8_ = (ulong)(uint)local_e8._28_4_ << 0x20;
  *psk_index = 0;
  local_108 = ch;
  if ((ch->psk).identities.count != 0) {
    paVar1 = &(ch->psk).identities;
    uVar10 = 0;
    local_c0 = ch_trunc.base;
    local_b8 = ch_trunc.len;
    do {
      local_e8.off = 0;
      psVar4 = tls->ctx->encrypt_ticket;
      pVar19.len = (ch->psk).identities.list[uVar10].identity.len;
      pVar19.base = paVar1->list[uVar10].identity.base;
      iVar8 = (*psVar4->cb)(psVar4,tls,0,&local_e8,pVar19);
      cVar17 = '\x04';
      if (iVar8 == 0) {
        unaff_RBP = (char *)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
LAB_00118a56:
        iVar8 = decode_session_identifier
                          (&issue_at,&ticket_psk,&age_add,&ticket_server_name,
                           &ticket_key_exchange_id,&ticket_csid,&ticket_negotiated_protocol,
                           local_e8.base,local_e8.base + local_e8.off);
        sVar6 = ticket_server_name.len;
        if (((iVar8 == 0) && (issue_at <= local_100)) &&
           (ppVar15 = tls->ctx, (long)local_100 - issue_at <= (ulong)ppVar15->ticket_lifetime * 1000
           )) {
          *local_f8 = 0;
          bVar13 = (byte)unaff_RBP ^ 1 | ((local_108->psk).field_0xb4 & 1) == 0;
          unaff_RBP = (char *)CONCAT71((int7)((ulong)unaff_RBP >> 8),bVar13);
          if (bVar13 == 0) {
            uVar11 = (long)local_100 -
                     (issue_at + (paVar1->list[uVar10].obfuscated_ticket_age - age_add));
            uVar10 = -uVar11;
            if (0 < (long)uVar11) {
              uVar10 = uVar11;
            }
            if ((ppVar15->max_early_data_size != 0) && (uVar10 < 0x2711)) {
              *local_f8 = 1;
            }
          }
          if (ticket_server_name.len == 0) {
            if (tls->server_name == (char *)0x0) goto LAB_00118ba6;
          }
          else {
            __s2 = tls->server_name;
            if (((__s2 != (char *)0x0) &&
                (local_c8 = ppVar15,
                iVar8 = strncmp((char *)ticket_server_name.base,__s2,ticket_server_name.len),
                unaff_RBP = __s2, iVar8 == 0)) && (ppVar15 = local_c8, __s2[sVar6] == '\0')) {
LAB_00118ba6:
              sVar6 = ticket_negotiated_protocol.len;
              pppVar12 = ppVar15->key_exchanges;
              ppVar5 = *pppVar12;
              cVar17 = '\x04';
              bVar18 = ppVar5 == (ptls_key_exchange_algorithm_t *)0x0;
              if (!bVar18) {
                uVar2 = ppVar5->id;
                while (uVar2 != ticket_key_exchange_id) {
                  pppVar12 = pppVar12 + 1;
                  ppVar5 = *pppVar12;
                  bVar18 = ppVar5 == (ptls_key_exchange_algorithm_t *)0x0;
                  if (bVar18) goto LAB_00118beb;
                  uVar2 = ppVar5->id;
                }
                if (!bVar18) {
                  tls->key_share = ppVar5;
                  cVar17 = '\0';
                }
              }
LAB_00118beb:
              if (((!bVar18) && (cVar17 = '\x04', ticket_csid == tls->cipher_suite->id)) &&
                 (((ticket_negotiated_protocol.len == 0 ||
                   (((unaff_RBP = tls->negotiated_protocol, unaff_RBP != (char *)0x0 &&
                     (iVar8 = strncmp((char *)ticket_negotiated_protocol.base,unaff_RBP,
                                      ticket_negotiated_protocol.len), iVar8 == 0)) &&
                    (unaff_RBP[sVar6] == '\0')))) &&
                  (sVar6 = (tls->key_schedule->hashes[0].algo)->digest_size, ticket_psk.len == sVar6
                  )))) {
                cVar17 = ((ch->psk).identities.list[*psk_index].binder.len == sVar6) * '\x05' +
                         '\x04';
              }
            }
          }
        }
      }
      else if (iVar8 == 0x209) {
        unaff_RBP = (char *)0x0;
        goto LAB_00118a56;
      }
      if (cVar17 != '\x04') {
        if (cVar17 != '\t') {
          return (int)unaff_RBP;
        }
        ikm.len = ticket_psk.len;
        ikm.base = ticket_psk.base;
        iVar8 = key_schedule_extract(tls->key_schedule,ikm);
        if ((iVar8 == 0) &&
           (iVar8 = derive_secret(tls->key_schedule,binder_key,"res binder"), sVar6 = local_b8,
           puVar7 = local_c0, iVar8 == 0)) {
          local_108 = (st_ptls_client_hello_t *)tls->key_schedule;
          local_100 = paVar1;
          if ((local_108->negotiated_groups).len != 0) {
            psVar16 = &(local_108->key_shares).len;
            sVar14 = 0;
            do {
              (**(code **)*psVar16)((undefined8 *)*psVar16,puVar7,sVar6);
              sVar14 = sVar14 + 1;
              psVar16 = psVar16 + 2;
            } while (sVar14 != (local_108->negotiated_groups).len);
          }
          iVar8 = calc_verify_data(binder_key,tls->key_schedule,binder_key);
          if (iVar8 == 0) {
            iVar9 = (*ptls_mem_equal)(local_100->list[*psk_index].binder.base,binder_key,
                                      (tls->key_schedule->hashes[0].algo)->digest_size);
            iVar8 = 0x33;
            if (iVar9 != 0) {
              iVar8 = 0;
            }
          }
        }
        goto LAB_00118d4a;
      }
      uVar10 = *psk_index + 1;
      *psk_index = uVar10;
    } while (uVar10 < (local_108->psk).identities.count);
  }
  *psk_index = 0xffffffffffffffff;
  *local_f8 = 0;
  tls->key_share = (ptls_key_exchange_algorithm_t *)0x0;
  iVar8 = 0;
LAB_00118d4a:
  (*ptls_clear_memory)(local_e8.base,local_e8.off);
  if (local_e8.is_allocated != 0) {
    free(local_e8.base);
  }
  local_e8.off = 0;
  local_e8.is_allocated = 0;
  local_e8._28_4_ = 0;
  local_e8.base = (uint8_t *)0x0;
  local_e8.capacity = 0;
  (*ptls_clear_memory)(binder_key,0x40);
  return iVar8;
}

Assistant:

static int try_psk_handshake(ptls_t *tls, size_t *psk_index, int *accept_early_data, struct st_ptls_client_hello_t *ch,
                             ptls_iovec_t ch_trunc)
{
    ptls_buffer_t decbuf;
    ptls_iovec_t ticket_psk, ticket_server_name, ticket_negotiated_protocol;
    uint64_t issue_at, now = tls->ctx->get_time->cb(tls->ctx->get_time);
    uint32_t age_add;
    uint16_t ticket_key_exchange_id, ticket_csid;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    int ret;

    ptls_buffer_init(&decbuf, "", 0);

    for (*psk_index = 0; *psk_index < ch->psk.identities.count; ++*psk_index) {
        struct st_ptls_client_hello_psk_t *identity = ch->psk.identities.list + *psk_index;
        /* decrypt and decode */
        int can_accept_early_data = 1;
        decbuf.off = 0;
        switch (tls->ctx->encrypt_ticket->cb(tls->ctx->encrypt_ticket, tls, 0, &decbuf, identity->identity)) {
        case 0: /* decrypted */
            break;
        case PTLS_ERROR_REJECT_EARLY_DATA: /* decrypted, but early data is rejected */
            can_accept_early_data = 0;
            break;
        default: /* decryption failure */
            continue;
        }
        if (decode_session_identifier(&issue_at, &ticket_psk, &age_add, &ticket_server_name, &ticket_key_exchange_id, &ticket_csid,
                                      &ticket_negotiated_protocol, decbuf.base, decbuf.base + decbuf.off) != 0)
            continue;
        /* check age */
        if (now < issue_at)
            continue;
        if (now - issue_at > (uint64_t)tls->ctx->ticket_lifetime * 1000)
            continue;
        *accept_early_data = 0;
        if (ch->psk.early_data_indication && can_accept_early_data) {
            /* accept early-data if abs(diff) between the reported age and the actual age is within += 10 seconds */
            int64_t delta = (now - issue_at) - (identity->obfuscated_ticket_age - age_add);
            if (delta < 0)
                delta = -delta;
            if (tls->ctx->max_early_data_size != 0 && delta <= PTLS_EARLY_DATA_MAX_DELAY)
                *accept_early_data = 1;
        }
        /* check server-name */
        if (ticket_server_name.len != 0) {
            if (tls->server_name == NULL)
                continue;
            if (!vec_is_string(ticket_server_name, tls->server_name))
                continue;
        } else {
            if (tls->server_name != NULL)
                continue;
        }
        { /* check key-exchange */
            ptls_key_exchange_algorithm_t **a;
            for (a = tls->ctx->key_exchanges; *a != NULL && (*a)->id != ticket_key_exchange_id; ++a)
                ;
            if (*a == NULL)
                continue;
            tls->key_share = *a;
        }
        /* check cipher-suite */
        if (ticket_csid != tls->cipher_suite->id)
            continue;
        /* check negotiated-protocol */
        if (ticket_negotiated_protocol.len != 0) {
            if (tls->negotiated_protocol == NULL)
                continue;
            if (!vec_is_string(ticket_negotiated_protocol, tls->negotiated_protocol))
                continue;
        }
        /* check the length of the decrypted psk and the PSK binder */
        if (ticket_psk.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;
        if (ch->psk.identities.list[*psk_index].binder.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;

        /* found */
        goto Found;
    }

    /* not found */
    *psk_index = SIZE_MAX;
    *accept_early_data = 0;
    tls->key_share = NULL;
    ret = 0;
    goto Exit;

Found:
    if ((ret = key_schedule_extract(tls->key_schedule, ticket_psk)) != 0)
        goto Exit;
    if ((ret = derive_secret(tls->key_schedule, binder_key, "res binder")) != 0)
        goto Exit;
    ptls__key_schedule_update_hash(tls->key_schedule, ch_trunc.base, ch_trunc.len);
    if ((ret = calc_verify_data(binder_key /* to conserve space, reuse binder_key for storing verify_data */, tls->key_schedule,
                                binder_key)) != 0)
        goto Exit;
    if (!ptls_mem_equal(ch->psk.identities.list[*psk_index].binder.base, binder_key,
                        tls->key_schedule->hashes[0].algo->digest_size)) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    ret = 0;

Exit:
    ptls_buffer_dispose(&decbuf);
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}